

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TargetCodeGenerator.cc
# Opt level: O1

void __thiscall flow::TargetCodeGenerator::generate(TargetCodeGenerator *this,IRHandler *handler)

{
  pointer puVar1;
  pointer puVar2;
  _List_node_base *p_Var3;
  pointer pMVar4;
  mapped_type mVar5;
  MatchInstr *this_00;
  size_t sVar6;
  mapped_type *pmVar7;
  BasicBlock *pBVar8;
  _Hash_node_base *p_Var9;
  _List_node_base *p_Var10;
  long lVar11;
  _List_node_base *p_Var12;
  long lVar13;
  _Hash_node_base *p_Var14;
  BasicBlock *bb;
  unordered_map<flow::BasicBlock_*,_unsigned_long,_std::hash<flow::BasicBlock_*>,_std::equal_to<flow::BasicBlock_*>,_std::allocator<std::pair<flow::BasicBlock_*const,_unsigned_long>_>_>
  basicBlockEntryPoints;
  vector<std::pair<flow::Constant_*,_flow::BasicBlock_*>,_std::allocator<std::pair<flow::Constant_*,_flow::BasicBlock_*>_>_>
  local_98;
  _List_node_base *local_80;
  MatchInstr *local_78;
  BasicBlock *local_70;
  _Hashtable<flow::BasicBlock_*,_std::pair<flow::BasicBlock_*const,_unsigned_long>,_std::allocator<std::pair<flow::BasicBlock_*const,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<flow::BasicBlock_*>,_std::hash<flow::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  local_68;
  
  sVar6 = ConstantPool::makeHandler(&this->cp_,handler);
  this->handlerId_ = sVar6;
  local_68._M_buckets = &local_68._M_single_bucket;
  local_68._M_bucket_count = 1;
  local_68._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_68._M_element_count = 0;
  local_68._M_rehash_policy._M_max_load_factor = 1.0;
  local_68._M_rehash_policy._M_next_resize = 0;
  local_68._M_single_bucket = (__node_base_ptr)0x0;
  for (p_Var12 = (handler->blocks_).
                 super__List_base<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>,_std::allocator<std::unique_ptr<flow::BasicBlock,_std::default_delete<flow::BasicBlock>_>_>_>
                 ._M_impl._M_node.super__List_node_base._M_next;
      p_Var12 != (_List_node_base *)&handler->blocks_; p_Var12 = p_Var12->_M_next) {
    local_98.
    super__Vector_base<std::pair<flow::Constant_*,_flow::BasicBlock_*>,_std::allocator<std::pair<flow::Constant_*,_flow::BasicBlock_*>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)p_Var12[1]._M_next;
    puVar1 = (this->code_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
             .super__Vector_impl_data._M_start;
    puVar2 = (this->code_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>._M_impl
             .super__Vector_impl_data._M_finish;
    pmVar7 = std::__detail::
             _Map_base<flow::BasicBlock_*,_std::pair<flow::BasicBlock_*const,_unsigned_long>,_std::allocator<std::pair<flow::BasicBlock_*const,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<flow::BasicBlock_*>,_std::hash<flow::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
             ::operator[]((_Map_base<flow::BasicBlock_*,_std::pair<flow::BasicBlock_*const,_unsigned_long>,_std::allocator<std::pair<flow::BasicBlock_*const,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<flow::BasicBlock_*>,_std::hash<flow::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                           *)&local_68,(key_type *)&local_98);
    *pmVar7 = (long)puVar2 - (long)puVar1 >> 3;
    p_Var3 = ((_List_node_base *)
             (local_98.
              super__Vector_base<std::pair<flow::Constant_*,_flow::BasicBlock_*>,_std::allocator<std::pair<flow::Constant_*,_flow::BasicBlock_*>_>_>
              ._M_impl.super__Vector_impl_data._M_start + 5))->_M_prev;
    for (p_Var10 = ((_List_node_base *)
                   (local_98.
                    super__Vector_base<std::pair<flow::Constant_*,_flow::BasicBlock_*>,_std::allocator<std::pair<flow::Constant_*,_flow::BasicBlock_*>_>_>
                    ._M_impl.super__Vector_impl_data._M_start + 5))->_M_next; p_Var10 != p_Var3;
        p_Var10 = (_List_node_base *)&p_Var10->_M_prev) {
      (**(code **)((long)p_Var10->_M_next->_M_next + 0x20))(p_Var10->_M_next,this);
    }
  }
  p_Var14 = (this->conditionalJumps_)._M_h._M_before_begin._M_nxt;
  if (p_Var14 != (_Hash_node_base *)0x0) {
    do {
      pmVar7 = std::__detail::
               _Map_base<flow::BasicBlock_*,_std::pair<flow::BasicBlock_*const,_unsigned_long>,_std::allocator<std::pair<flow::BasicBlock_*const,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<flow::BasicBlock_*>,_std::hash<flow::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<flow::BasicBlock_*,_std::pair<flow::BasicBlock_*const,_unsigned_long>,_std::allocator<std::pair<flow::BasicBlock_*const,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<flow::BasicBlock_*>,_std::hash<flow::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)&local_68,(key_type *)(p_Var14 + 1));
      p_Var9 = p_Var14[2]._M_nxt;
      if (p_Var9 != p_Var14 + 2) {
        mVar5 = *pmVar7;
        puVar1 = (this->code_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        do {
          puVar1[(long)p_Var9[2]._M_nxt] =
               (ulong)*(ushort *)&p_Var9[3]._M_nxt | (long)((int)mVar5 << 0x10);
          p_Var9 = p_Var9->_M_nxt;
        } while (p_Var9 != p_Var14 + 2);
      }
      p_Var14 = p_Var14->_M_nxt;
    } while (p_Var14 != (_Hash_node_base *)0x0);
  }
  std::
  _Hashtable<flow::BasicBlock_*,_std::pair<flow::BasicBlock_*const,_std::__cxx11::list<flow::TargetCodeGenerator::ConditionalJump,_std::allocator<flow::TargetCodeGenerator::ConditionalJump>_>_>,_std::allocator<std::pair<flow::BasicBlock_*const,_std::__cxx11::list<flow::TargetCodeGenerator::ConditionalJump,_std::allocator<flow::TargetCodeGenerator::ConditionalJump>_>_>_>,_std::__detail::_Select1st,_std::equal_to<flow::BasicBlock_*>,_std::hash<flow::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::clear(&(this->conditionalJumps_)._M_h);
  p_Var14 = (this->unconditionalJumps_)._M_h._M_before_begin._M_nxt;
  if (p_Var14 != (_Hash_node_base *)0x0) {
    do {
      pmVar7 = std::__detail::
               _Map_base<flow::BasicBlock_*,_std::pair<flow::BasicBlock_*const,_unsigned_long>,_std::allocator<std::pair<flow::BasicBlock_*const,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<flow::BasicBlock_*>,_std::hash<flow::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
               ::operator[]((_Map_base<flow::BasicBlock_*,_std::pair<flow::BasicBlock_*const,_unsigned_long>,_std::allocator<std::pair<flow::BasicBlock_*const,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<flow::BasicBlock_*>,_std::hash<flow::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                             *)&local_68,(key_type *)(p_Var14 + 1));
      p_Var9 = p_Var14[2]._M_nxt;
      if (p_Var9 != p_Var14 + 2) {
        mVar5 = *pmVar7;
        puVar1 = (this->code_).super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>.
                 _M_impl.super__Vector_impl_data._M_start;
        do {
          puVar1[(long)p_Var9[2]._M_nxt] =
               (ulong)*(ushort *)&p_Var9[3]._M_nxt | (long)((int)mVar5 << 0x10);
          p_Var9 = p_Var9->_M_nxt;
        } while (p_Var9 != p_Var14 + 2);
      }
      p_Var14 = p_Var14->_M_nxt;
    } while (p_Var14 != (_Hash_node_base *)0x0);
  }
  std::
  _Hashtable<flow::BasicBlock_*,_std::pair<flow::BasicBlock_*const,_std::__cxx11::list<flow::TargetCodeGenerator::UnconditionalJump,_std::allocator<flow::TargetCodeGenerator::UnconditionalJump>_>_>,_std::allocator<std::pair<flow::BasicBlock_*const,_std::__cxx11::list<flow::TargetCodeGenerator::UnconditionalJump,_std::allocator<flow::TargetCodeGenerator::UnconditionalJump>_>_>_>,_std::__detail::_Select1st,_std::equal_to<flow::BasicBlock_*>,_std::hash<flow::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::clear(&(this->unconditionalJumps_)._M_h);
  local_80 = (_List_node_base *)&this->matchHints_;
  p_Var12 = (this->matchHints_).
            super__List_base<std::pair<flow::MatchInstr_*,_unsigned_long>,_std::allocator<std::pair<flow::MatchInstr_*,_unsigned_long>_>_>
            ._M_impl._M_node.super__List_node_base._M_next;
  if (p_Var12 != local_80) {
    do {
      local_78 = (MatchInstr *)p_Var12[1]._M_next;
      p_Var10 = p_Var12[1]._M_prev;
      MatchInstr::cases(&local_98,local_78);
      pMVar4 = (this->cp_).matchDefs_.
               super__Vector_base<flow::MatchDef,_std::allocator<flow::MatchDef>_>._M_impl.
               super__Vector_impl_data._M_start;
      if ((long)local_98.
                super__Vector_base<std::pair<flow::Constant_*,_flow::BasicBlock_*>,_std::allocator<std::pair<flow::Constant_*,_flow::BasicBlock_*>_>_>
                ._M_impl.super__Vector_impl_data._M_finish -
          (long)local_98.
                super__Vector_base<std::pair<flow::Constant_*,_flow::BasicBlock_*>,_std::allocator<std::pair<flow::Constant_*,_flow::BasicBlock_*>_>_>
                ._M_impl.super__Vector_impl_data._M_start != 0) {
        lVar13 = (long)local_98.
                       super__Vector_base<std::pair<flow::Constant_*,_flow::BasicBlock_*>,_std::allocator<std::pair<flow::Constant_*,_flow::BasicBlock_*>_>_>
                       ._M_impl.super__Vector_impl_data._M_finish -
                 (long)local_98.
                       super__Vector_base<std::pair<flow::Constant_*,_flow::BasicBlock_*>,_std::allocator<std::pair<flow::Constant_*,_flow::BasicBlock_*>_>_>
                       ._M_impl.super__Vector_impl_data._M_start >> 4;
        lVar11 = 8;
        do {
          pmVar7 = std::__detail::
                   _Map_base<flow::BasicBlock_*,_std::pair<flow::BasicBlock_*const,_unsigned_long>,_std::allocator<std::pair<flow::BasicBlock_*const,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<flow::BasicBlock_*>,_std::hash<flow::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                   ::operator[]((_Map_base<flow::BasicBlock_*,_std::pair<flow::BasicBlock_*const,_unsigned_long>,_std::allocator<std::pair<flow::BasicBlock_*const,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<flow::BasicBlock_*>,_std::hash<flow::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                                 *)&local_68,
                                (key_type *)
                                ((long)&(local_98.
                                         super__Vector_base<std::pair<flow::Constant_*,_flow::BasicBlock_*>,_std::allocator<std::pair<flow::Constant_*,_flow::BasicBlock_*>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start)->first + lVar11)
                               );
          *(mapped_type *)
           (*(long *)&pMVar4[(long)p_Var10].cases.
                      super__Vector_base<flow::MatchCaseDef,_std::allocator<flow::MatchCaseDef>_>.
                      _M_impl.super__Vector_impl_data + lVar11) = *pmVar7;
          lVar11 = lVar11 + 0x10;
          lVar13 = lVar13 + -1;
        } while (lVar13 != 0);
      }
      this_00 = local_78;
      pBVar8 = MatchInstr::elseBlock(local_78);
      if (pBVar8 != (BasicBlock *)0x0) {
        local_70 = MatchInstr::elseBlock(this_00);
        pmVar7 = std::__detail::
                 _Map_base<flow::BasicBlock_*,_std::pair<flow::BasicBlock_*const,_unsigned_long>,_std::allocator<std::pair<flow::BasicBlock_*const,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<flow::BasicBlock_*>,_std::hash<flow::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                 ::operator[]((_Map_base<flow::BasicBlock_*,_std::pair<flow::BasicBlock_*const,_unsigned_long>,_std::allocator<std::pair<flow::BasicBlock_*const,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<flow::BasicBlock_*>,_std::hash<flow::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>,_true>
                               *)&local_68,&local_70);
        pMVar4[(long)p_Var10].elsePC = *pmVar7;
      }
      if ((_List_node_base *)
          local_98.
          super__Vector_base<std::pair<flow::Constant_*,_flow::BasicBlock_*>,_std::allocator<std::pair<flow::Constant_*,_flow::BasicBlock_*>_>_>
          ._M_impl.super__Vector_impl_data._M_start != (_List_node_base *)0x0) {
        operator_delete(local_98.
                        super__Vector_base<std::pair<flow::Constant_*,_flow::BasicBlock_*>,_std::allocator<std::pair<flow::Constant_*,_flow::BasicBlock_*>_>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_98.
                              super__Vector_base<std::pair<flow::Constant_*,_flow::BasicBlock_*>,_std::allocator<std::pair<flow::Constant_*,_flow::BasicBlock_*>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_98.
                              super__Vector_base<std::pair<flow::Constant_*,_flow::BasicBlock_*>,_std::allocator<std::pair<flow::Constant_*,_flow::BasicBlock_*>_>_>
                              ._M_impl.super__Vector_impl_data._M_start);
      }
      p_Var12 = p_Var12->_M_next;
    } while (p_Var12 != local_80);
  }
  std::__cxx11::
  list<std::pair<flow::MatchInstr_*,_unsigned_long>,_std::allocator<std::pair<flow::MatchInstr_*,_unsigned_long>_>_>
  ::clear((list<std::pair<flow::MatchInstr_*,_unsigned_long>,_std::allocator<std::pair<flow::MatchInstr_*,_unsigned_long>_>_>
           *)local_80);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::_M_move_assign
            (&(this->cp_).handlers_.
              super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start[this->handlerId_].second,&this->code_);
  std::deque<const_flow::Value_*,_std::allocator<const_flow::Value_*>_>::clear(&this->stack_);
  std::
  _Hashtable<flow::BasicBlock_*,_std::pair<flow::BasicBlock_*const,_unsigned_long>,_std::allocator<std::pair<flow::BasicBlock_*const,_unsigned_long>_>,_std::__detail::_Select1st,_std::equal_to<flow::BasicBlock_*>,_std::hash<flow::BasicBlock_*>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_false,_true>_>
  ::~_Hashtable(&local_68);
  return;
}

Assistant:

void TargetCodeGenerator::generate(IRHandler* handler) {
  // explicitely forward-declare handler, so we can use its ID internally.
  handlerId_ = cp_.makeHandler(handler);

  std::unordered_map<BasicBlock*, size_t> basicBlockEntryPoints;

  // generate code for all basic blocks, sequentially
  for (BasicBlock* bb : handler->basicBlocks()) {
    basicBlockEntryPoints[bb] = getInstructionPointer();
    for (Instr* instr : bb->instructions()) {
      instr->accept(*this);
    }
  }

  // fixiate conditional jump instructions
  for (const auto& target : conditionalJumps_) {
    size_t targetPC = basicBlockEntryPoints[target.first];
    for (const auto& source : target.second) {
      code_[source.pc] = makeInstruction(source.opcode, targetPC);
    }
  }
  conditionalJumps_.clear();

  // fixiate unconditional jump instructions
  for (const auto& target : unconditionalJumps_) {
    size_t targetPC = basicBlockEntryPoints[target.first];
    for (const auto& source : target.second) {
      code_[source.pc] = makeInstruction(source.opcode, targetPC);
    }
  }
  unconditionalJumps_.clear();

  // fixiate match jump table
  for (const auto& hint : matchHints_) {
    size_t matchId = hint.second;
    MatchInstr* matchInstr = hint.first;
    const auto& cases = matchInstr->cases();
    MatchDef& def = cp_.getMatchDef(matchId);

    for (size_t i = 0, e = cases.size(); i != e; ++i) {
      def.cases[i].pc = basicBlockEntryPoints[cases[i].second];
    }

    if (matchInstr->elseBlock()) {
      def.elsePC = basicBlockEntryPoints[matchInstr->elseBlock()];
    }
  }
  matchHints_.clear();

  cp_.getHandler(handlerId_).second = std::move(code_);

  // cleanup remaining handler-local work vars
  //FLOW_TRACE("flow: stack depth after handler code generation: {}", stack_.size());
  stack_.clear();
}